

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O0

void Fxu_MatrixAddDivisor(Fxu_Matrix *p,Fxu_Cube *pCube1,Fxu_Cube *pCube2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint Key;
  int fFound;
  int nLits2;
  int nLits1;
  int nBase;
  Fxu_Double *pDiv;
  Fxu_Pair *pPair;
  Fxu_Cube *pCube2_local;
  Fxu_Cube *pCube1_local;
  Fxu_Matrix *p_local;
  
  pPair = (Fxu_Pair *)pCube2;
  pCube2_local = pCube1;
  pCube1_local = (Fxu_Cube *)p;
  Fxu_PairCanonicize(&pCube2_local,(Fxu_Cube **)&pPair);
  uVar2 = Fxu_PairHashKey((Fxu_Matrix *)pCube1_local,pCube2_local,(Fxu_Cube *)pPair,&nLits2,&fFound,
                          (int *)&Key);
  pDiv = (Fxu_Double *)Fxu_PairAlloc((Fxu_Matrix *)pCube1_local,pCube2_local,(Fxu_Cube *)pPair);
  ((Fxu_Pair *)pDiv)->nBase = nLits2;
  ((Fxu_Pair *)pDiv)->nLits1 = fFound;
  ((Fxu_Pair *)pDiv)->nLits2 = Key;
  bVar1 = false;
  uVar2 = uVar2 % *(uint *)&pCube1_local->pOrder;
  _nLits1 = *(Fxu_Pair **)(&pCube1_local->pNext->iCube + (ulong)uVar2 * 6);
  do {
    if (_nLits1 == (Fxu_Pair *)0x0) {
LAB_005535ca:
      if (!bVar1) {
        _nLits1 = (Fxu_Pair *)Fxu_MemFetch((Fxu_Matrix *)pCube1_local,0x40);
        memset(_nLits1,0,0x40);
        *(uint *)&_nLits1->field_0xc = uVar2;
        iVar3 = pCube1_local[1].iCube;
        pCube1_local[1].iCube = iVar3 + 1;
        _nLits1->nLits1 = iVar3;
        Fxu_ListTableAddDivisor((Fxu_Matrix *)pCube1_local,(Fxu_Double *)_nLits1);
        _nLits1->nBase = _nLits1->nBase - (pDiv->Num + pDiv->HNum);
      }
      Fxu_PairAdd((Fxu_Pair *)pDiv);
      (pDiv->lPairs).pHead = _nLits1;
      Fxu_ListDoubleAddPairLast((Fxu_Double *)_nLits1,(Fxu_Pair *)pDiv);
      _nLits1->nBase = pDiv->Num + pDiv->HNum + -1 + pDiv->Weight + _nLits1->nBase;
      if (bVar1) {
        Fxu_HeapDoubleUpdate((Fxu_HeapDouble *)pCube1_local[1].pFirst,(Fxu_Double *)_nLits1);
      }
      else {
        Fxu_HeapDoubleInsert((Fxu_HeapDouble *)pCube1_local[1].pFirst,(Fxu_Double *)_nLits1);
      }
      return;
    }
    iVar3 = Fxu_PairCompare((Fxu_Pair *)pDiv,(Fxu_Pair *)_nLits1->pCube1);
    if (iVar3 != 0) {
      bVar1 = true;
      goto LAB_005535ca;
    }
    _nLits1 = _nLits1->pDPrev;
  } while( true );
}

Assistant:

void Fxu_MatrixAddDivisor( Fxu_Matrix * p, Fxu_Cube * pCube1, Fxu_Cube * pCube2 )
{
	Fxu_Pair * pPair;
	Fxu_Double * pDiv;
    int nBase, nLits1, nLits2;
    int fFound;
	unsigned Key;

    // canonicize the pair
    Fxu_PairCanonicize( &pCube1, &pCube2 );
    // compute the hash key
    Key = Fxu_PairHashKey( p, pCube1, pCube2, &nBase, &nLits1, &nLits2 );

    // create the cube pair
    pPair = Fxu_PairAlloc( p, pCube1, pCube2 );
    pPair->nBase  = nBase;
    pPair->nLits1 = nLits1;
    pPair->nLits2 = nLits2;

    // check if the divisor for this pair already exists
    fFound = 0;
    Key %= p->nTableSize;
	Fxu_TableForEachDouble( p, Key, pDiv )
    {
		if ( Fxu_PairCompare( pPair, pDiv->lPairs.pTail ) ) // they are equal
        {
            fFound = 1;
            break;
        }
    }

    if ( !fFound )
    {   // create the new divisor
	    pDiv = MEM_ALLOC_FXU( p, Fxu_Double, 1 );
	    memset( pDiv, 0, sizeof(Fxu_Double) );
	    pDiv->Key = Key;
	    // set the number of this divisor
	    pDiv->Num = p->nDivsTotal++; // p->nDivs;
	    // insert the divisor in the table
	    Fxu_ListTableAddDivisor( p, pDiv );
	    // set the initial cost of the divisor
	    pDiv->Weight -= pPair->nLits1 + pPair->nLits2;
    }

	// link the pair to the cubes
	Fxu_PairAdd( pPair );
	// connect the pair and the divisor
	pPair->pDiv = pDiv;
	Fxu_ListDoubleAddPairLast( pDiv, pPair );	
    // update the max number of pairs in a divisor
//    if ( p->nPairsMax < pDiv->lPairs.nItems )
//        p->nPairsMax = pDiv->lPairs.nItems;
	// update the divisor's weight
	pDiv->Weight += pPair->nLits1 + pPair->nLits2 - 1 + pPair->nBase;
    if ( fFound ) // update the divisor in the heap
        Fxu_HeapDoubleUpdate( p->pHeapDouble, pDiv );
    else  // add the new divisor to the heap
        Fxu_HeapDoubleInsert( p->pHeapDouble, pDiv );
}